

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVector.h
# Opt level: O1

void __thiscall AlphaVector::SetBetaI(AlphaVector *this,BGPolicyIndex betaI)

{
  E *this_00;
  
  if (-2 < betaI) {
    this->_m_betaI = betaI;
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"AlphaVector::SetBetaI() BG policy index has to be >=-1");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void SetBetaI(BGPolicyIndex betaI)
        {
            if(betaI<-1)
                throw(E("AlphaVector::SetBetaI() BG policy index has to be >=-1"));
            _m_betaI=betaI;
        }